

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

S2Point * __thiscall
S2Polygon::ProjectToBoundary(S2Point *__return_storage_ptr__,S2Polygon *this,S2Point *x)

{
  Result RVar1;
  Result edge;
  Options options;
  S2ClosestEdgeQuery q;
  Result local_368;
  Options local_358;
  Target local_340;
  VType local_338;
  VType VStack_330;
  VType local_328;
  S2ClosestEdgeQuery local_320;
  
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::Options(&local_358);
  local_358.include_interiors_ = false;
  S2ClosestEdgeQuery::S2ClosestEdgeQuery
            (&local_320,&(this->index_).super_S2ShapeIndex,(Options *)&local_358);
  local_328 = x->c_[2];
  local_338 = x->c_[0];
  VStack_330 = x->c_[1];
  local_340._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_00304ae0;
  RVar1 = S2ClosestEdgeQuery::FindClosestEdge(&local_320,&local_340);
  local_368._8_8_ = RVar1._8_8_;
  local_368.distance_ = RVar1.distance_.super_S1ChordAngle.length2_;
  S2ClosestEdgeQuery::Project(__return_storage_ptr__,&local_320,x,&local_368);
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery(&local_320);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polygon::ProjectToBoundary(const S2Point& x) const {
  S2ClosestEdgeQuery::Options options;
  options.set_include_interiors(false);
  S2ClosestEdgeQuery q(&index_, options);
  S2ClosestEdgeQuery::PointTarget target(x);
  S2ClosestEdgeQuery::Result edge = q.FindClosestEdge(&target);
  return q.Project(x, edge);
}